

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# network.c
# Opt level: O3

int net_service_lookup(char *service)

{
  ushort uVar1;
  servent *psVar2;
  uint uVar3;
  
  uVar3 = 0;
  psVar2 = getservbyname(service,(char *)0x0);
  if (psVar2 != (servent *)0x0) {
    uVar1 = (ushort)psVar2->s_port;
    uVar3 = (uint)(ushort)(uVar1 << 8 | uVar1 >> 8);
  }
  return uVar3;
}

Assistant:

int net_service_lookup(const char *service)
{
    struct servent *se;
    se = getservbyname(service, NULL);
    if (se != NULL)
        return ntohs(se->s_port);
    else
        return 0;
}